

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phi_sum.cpp
# Opt level: O3

int256_t * __thiscall
primesum::phi_sum(int256_t *__return_storage_ptr__,primesum *this,int128_t x,int64_t a)

{
  _anonymous_namespace_ *this_00;
  ulong uVar1;
  long lVar2;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  int128_t *piVar3;
  _anonymous_namespace_ *this_01;
  primesum *in_RCX;
  long extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  primesum *primes;
  pointer piVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  int256_t n;
  int256_t res;
  int256_t fx;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  vector<int,_std::allocator<int>_> local_e0;
  primesum *local_c8;
  ulong uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  primesum *local_a8;
  ulong uStack_a0;
  ulong local_98;
  ulong uStack_90;
  primesum *local_88;
  ulong local_80;
  primesum *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  int256_t local_58;
  
  if (-a < (long)(ulong)((primesum *)0x7fffffffffffffff < this)) {
    if ((long)in_RCX < 10) {
      x_00._8_8_ = in_stack_ffffffffffffff10;
      x_00._0_8_ = in_stack_ffffffffffffff08;
      (anonymous_namespace)::phi_sum256<1,std::array<int,10ul>const&>
                (__return_storage_ptr__,(_anonymous_namespace_ *)this,(int128_t)x_00,a,
                 (array<int,_10UL> *)in_RCX);
    }
    else {
      generate_n_primes(&local_e0,(int64_t)in_RCX);
      uVar6 = 0;
      lVar8 = 0;
      uVar4 = 0;
      uVar9 = 0;
      local_88 = this;
      do {
        piVar7 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        primes = (primesum *)
                 (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)in_RCX];
        lVar2 = ((long)primes >> 0x3f) - a;
        if ((SBORROW8((long)primes >> 0x3f,a) != SBORROW8(lVar2,(ulong)(primes < local_88))) ==
            (long)(lVar2 - (ulong)(primes < local_88)) < 0) {
          *(ulong *)&__return_storage_ptr__->high = uVar6;
          *(long *)((long)&__return_storage_ptr__->high + 8) = lVar8;
          *(ulong *)&__return_storage_ptr__->low = uVar4 + 1;
          *(ulong *)((long)&__return_storage_ptr__->low + 8) = uVar9 + (0xfffffffffffffffe < uVar4);
          if (CARRY8(uVar9,(ulong)(0xfffffffffffffffe < uVar4))) {
            *(ulong *)&__return_storage_ptr__->high = uVar6 + 1;
            *(ulong *)((long)&__return_storage_ptr__->high + 8) =
                 lVar8 + (ulong)(0xfffffffffffffffe < uVar6);
          }
          goto LAB_0010e712;
        }
        local_80 = uVar4;
        if (a == 0) {
          auVar12._8_8_ = 0;
          auVar12._0_8_ = (ulong)local_88 / (ulong)primes;
        }
        else {
          auVar12 = __divti3(local_88,a,primes);
        }
        this_01 = auVar12._0_8_;
        local_b8 = 0;
        uStack_b0 = 0;
        local_c8 = (primesum *)0x0;
        uStack_c0 = 0;
        this_00 = (_anonymous_namespace_ *)in_RCX + -1;
        lVar2 = -auVar12._8_8_;
        if (lVar2 < (long)(ulong)((_anonymous_namespace_ *)0x7fffffffffffffff < this_01)) {
          x_01._8_8_ = __return_storage_ptr__;
          x_01._0_8_ = in_stack_ffffffffffffff08;
          (anonymous_namespace)::phi_sum256<_1,std::vector<int,std::allocator<int>>&>
                    ((int256_t *)&local_a8,this_01,(int128_t)x_01,auVar12._8_8_,
                     (vector<int,_std::allocator<int>_> *)this_00);
          local_b8 = local_98;
          uStack_b0 = uStack_90;
          local_c8 = local_a8;
          uStack_c0 = uStack_a0;
          piVar7 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        else {
          local_c8 = (primesum *)
                     (anonymous_namespace)::phi_sum128<_1,std::vector<int,std::allocator<int>>&>
                               ((int128_t *)this_01,this_00,(int64_t)&local_e0,
                                lVar2 - (ulong)((_anonymous_namespace_ *)0x7fffffffffffffff <
                                               this_01),(vector<int,_std::allocator<int>_> *)primes)
          ;
          local_b8 = (long)extraout_RDX_00 >> 0x3f;
          uStack_c0 = extraout_RDX_00;
          uStack_b0 = local_b8;
        }
        local_a8 = (primesum *)(long)piVar7[(long)in_RCX];
        uStack_a0 = (long)local_a8 >> 0x3f;
        local_98 = (ulong)(piVar7[(long)in_RCX] >> 0x1f);
        uStack_90 = local_98;
        int256_t::operator*(&local_58,(int256_t *)&local_c8,(int256_t *)&local_a8);
        bVar10 = CARRY8(uVar6,(ulong)local_58.high);
        uVar5 = uVar6 + (ulong)local_58.high;
        uVar4 = local_80 + (ulong)local_58.low;
        bVar11 = CARRY8(uVar9,local_58.low._8_8_);
        uVar6 = uVar9 + local_58.low._8_8_;
        uVar9 = uVar6 + CARRY8(local_80,(ulong)local_58.low);
        uVar1 = (ulong)(bVar11 || CARRY8(uVar6,(ulong)CARRY8(local_80,(ulong)local_58.low)));
        uVar6 = uVar5 + uVar1;
        lVar8 = lVar8 + local_58.high._8_8_ + (ulong)bVar10 + (ulong)CARRY8(uVar5,uVar1);
        bVar10 = 1 < (long)in_RCX;
        in_RCX = (primesum *)this_00;
      } while (bVar10);
      local_c8 = local_88;
      local_b8 = a >> 0x3f;
      local_78 = local_88 + 1;
      local_70 = a + (ulong)((primesum *)0xfffffffffffffffe < local_88);
      uStack_c0 = a;
      uStack_b0 = local_b8;
      local_68 = local_b8;
      local_60 = local_b8;
      int256_t::operator*((int256_t *)&local_a8,(int256_t *)&local_c8,(int256_t *)&local_78);
      local_58.low._8_8_ = local_98 << 0x3f | uStack_a0 >> 1;
      local_58.low._0_8_ = (ulong)local_a8 >> 1 | uStack_a0 << 0x3f;
      local_58.high._0_8_ = local_98 >> 1 | uStack_90 << 0x3f;
      local_58.high._8_8_ = uStack_90 >> 1;
      uStack_a0 = 0;
      local_98 = 0;
      local_a8 = (primesum *)0x1;
      uStack_90 = 0;
      int256_t::operator*((int256_t *)&local_78,&local_58,(int256_t *)&local_a8);
      uVar1 = (ulong)(CARRY8(uVar9,local_70) ||
                     CARRY8(uVar9 + local_70,(ulong)CARRY8(uVar4,(ulong)local_78)));
      *(ulong *)((long)&__return_storage_ptr__->low + 8) =
           uVar9 + local_70 + (ulong)CARRY8(uVar4,(ulong)local_78);
      *(primesum **)&__return_storage_ptr__->low = local_78 + uVar4;
      *(ulong *)&__return_storage_ptr__->high = uVar6 + local_68 + uVar1;
      *(ulong *)((long)&__return_storage_ptr__->high + 8) =
           lVar8 + local_60 + (ulong)CARRY8(uVar6,local_68) + (ulong)CARRY8(uVar6 + local_68,uVar1);
      if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
LAB_0010e712:
        operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    piVar3 = phi_sum((int128_t *)this,in_RCX,a,0x7fffffffffffffff);
    *(long *)((long)&__return_storage_ptr__->low + 8) = extraout_RDX;
    *(int128_t **)&__return_storage_ptr__->low = piVar3;
    *(long *)((long)&__return_storage_ptr__->high + 8) = extraout_RDX >> 0x3f;
    *(long *)&__return_storage_ptr__->high = extraout_RDX >> 0x3f;
  }
  return __return_storage_ptr__;
}

Assistant:

int256_t phi_sum(int128_t x, int64_t a)
{
  if (x <= numeric_limits<int64_t>::max())
    return phi_sum((int64_t) x, a);

  if (a < 10)
    return phi_sum256<1>(x, a, small_primes_);
  else
    return phi_sum256<1>(x, a, generate_n_primes(a));
}